

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

void __thiscall CBinds::OnConsoleInit(CBinds *this)

{
  IConfigManager *pIVar1;
  IConsole *pIVar2;
  undefined8 in_RDI;
  IConfigManager *pConfigManager;
  CBinds *in_stack_ffffffffffffffe0;
  
  CComponent::Kernel((CComponent *)0x1481cc);
  pIVar1 = IKernel::RequestInterface<IConfigManager>((IKernel *)in_stack_ffffffffffffffe0);
  if (pIVar1 != (IConfigManager *)0x0) {
    (*(pIVar1->super_IInterface)._vptr_IInterface[7])(pIVar1,ConfigSaveCallback,in_RDI);
  }
  pIVar2 = CComponent::Console((CComponent *)0x148202);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"bind","s[key] r[command]",2,ConBind,in_RDI,"Bind key to execute the command");
  pIVar2 = CComponent::Console((CComponent *)0x14823f);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"unbind","s[key]",2,ConUnbind,in_RDI,"Unbind key");
  pIVar2 = CComponent::Console((CComponent *)0x14827c);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"unbindall","",2,ConUnbindAll,in_RDI,"Unbind all keys");
  pIVar2 = CComponent::Console((CComponent *)0x1482b9);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"binds","?s[key]",2,ConBinds,in_RDI,"Show list of key bindings");
  SetDefaults(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void CBinds::OnConsoleInit()
{
	// bindings
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	Console()->Register("bind", "s[key] r[command]", CFGFLAG_CLIENT, ConBind, this, "Bind key to execute the command");
	Console()->Register("unbind", "s[key]", CFGFLAG_CLIENT, ConUnbind, this, "Unbind key");
	Console()->Register("unbindall", "", CFGFLAG_CLIENT, ConUnbindAll, this, "Unbind all keys");
	Console()->Register("binds", "?s[key]", CFGFLAG_CLIENT, ConBinds, this, "Show list of key bindings");

	// default bindings
	SetDefaults();
}